

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_date_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv)

{
  int iVar1;
  int iVar2;
  JSValueUnion JVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  JSValueUnion JVar8;
  JSValue *pJVar9;
  int64_t *piVar10;
  int64_t iVar11;
  JSRefCountHeader *p_1;
  double dVar12;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  anon_union_8_2_94730072 u;
  JSValue ctor;
  JSValue JVar13;
  JSValue JVar14;
  JSValue JVar15;
  JSValue val;
  JSValue val_00;
  JSValue val_01;
  double a;
  timeval tv;
  JSValueUnion local_98;
  JSValueUnion local_90;
  double local_88;
  undefined8 uStack_80;
  ulong local_78;
  ulong local_70;
  JSValueUnion local_68;
  long lStack_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined8 local_38;
  JSValue *argv_00;
  
  uVar5 = new_target.tag;
  val.u = new_target.u;
  uVar7 = uVar5 & 0xffffffff;
  iVar2 = (int)new_target.tag;
  uVar6 = 0;
  if (uVar7 != 3) {
    uVar6 = argc;
  }
  if (uVar6 == 1) {
    iVar11 = argv->tag;
    uVar6 = (uint)iVar11;
    if (uVar6 == 0xffffffff) {
      JVar8 = (JSValueUnion)(argv->u).ptr;
      if (*(short *)((long)JVar8.ptr + 6) != 10) goto LAB_0012f87f;
      iVar1 = (int)*(int64_t *)((long)JVar8.ptr + 0x38);
      if ((iVar1 != 7) && (iVar1 != 0)) goto LAB_0012f87f;
      val_00.tag = *(int64_t *)((long)JVar8.ptr + 0x38);
      val_00.u.ptr = ((JSValueUnion *)((long)JVar8.ptr + 0x30))->ptr;
      iVar1 = JS_ToFloat64(ctx,&local_98.float64,val_00);
joined_r0x0012f998:
      JVar3 = local_98;
      if (iVar1 != 0) {
LAB_0012fac9:
        iVar11 = 6;
        uVar5 = 0;
        uVar7 = 0;
        goto LAB_0012fad3;
      }
    }
    else {
      JVar8 = (JSValueUnion)(argv->u).ptr;
LAB_0012f87f:
      if (0xfffffff4 < uVar6) {
        *(int *)JVar8.ptr = *JVar8.ptr + 1;
      }
      iVar1 = 2;
      JVar14.tag = iVar11;
      JVar14.u.ptr = JVar8.ptr;
      local_90 = val.u;
      JVar14 = JS_ToPrimitiveFree(ctx,JVar14,2);
      JVar13.tag = JVar14.tag;
      JVar3 = JVar14.u;
      uVar6 = (uint)JVar14.tag;
      _local_68 = JVar14;
      if (uVar6 == 0xfffffff9) {
        JVar13.u.ptr = JVar8.ptr;
        JVar13 = js_Date_parse(ctx,JVar13,iVar1,(JSValue *)&local_68);
        iVar1 = *JVar3.ptr;
        *(int *)JVar3.ptr = iVar1 + -1;
        if (iVar1 < 2) {
          __JS_FreeValueRT(ctx->rt,JVar14);
        }
        val.u = local_90;
        uVar6 = (uint)JVar13.tag;
        if (uVar6 == 6) goto LAB_0012fac9;
        if (uVar6 < 3) {
          JVar3.float64 = (double)JVar13.u._0_4_;
        }
        else {
          JVar3 = JVar13.u;
          if (uVar6 != 7) {
            iVar1 = __JS_ToFloat64Free(ctx,&local_98.float64,JVar13);
            goto joined_r0x0012f998;
          }
        }
      }
      else {
        val.u = local_90;
        if (uVar6 < 3) {
          JVar3.float64 = (double)JVar14.u._0_4_;
        }
        else if (uVar6 != 7) {
          iVar1 = __JS_ToFloat64Free(ctx,&local_98.float64,JVar14);
          val.u = local_90;
          goto joined_r0x0012f998;
        }
      }
    }
    local_98 = JVar3;
    if (8.64e+15 < ABS(local_98.float64)) {
      local_88 = NAN;
      uStack_80 = 0;
    }
    else {
      dVar12 = trunc(local_98.float64);
      local_88 = dVar12 + 0.0;
      uStack_80 = 0;
    }
  }
  else if (uVar6 == 0) {
    gettimeofday((timeval *)&local_68,(__timezone_ptr_t)0x0);
    local_88 = (double)(lStack_60 / 1000 + (long)local_68.ptr * 1000);
    uStack_80 = extraout_XMM0_Qb;
  }
  else {
    local_48 = (undefined1  [16])0x0;
    local_68 = (JSValueUnion)0x0;
    lStack_60 = 0;
    local_38 = 0;
    local_58 = ZEXT816(0x3ff0000000000000);
    uVar4 = 7;
    if ((int)uVar6 < 7) {
      uVar4 = (ulong)uVar6;
    }
    iVar2 = (int)uVar4;
    local_78 = uVar7;
    local_70 = uVar5;
    if ((int)uVar6 < 1) {
      uVar5 = 0;
      local_90 = val.u;
LAB_0012f939:
      if ((int)uVar5 == iVar2) goto LAB_0012f93e;
      local_88 = NAN;
      uStack_80 = 0;
    }
    else {
      local_88 = (double)CONCAT44(local_88._4_4_,iVar2);
      piVar10 = &argv->tag;
      uVar5 = 0;
      local_90 = val.u;
      do {
        val_01.tag = *piVar10;
        val_01.u.ptr = ((JSValueUnion *)(piVar10 + -1))->ptr;
        iVar2 = JS_ToFloat64(ctx,&local_98.float64,val_01);
        if (iVar2 != 0) goto LAB_0012fac9;
        if (0x7fefffffffffffff < ((ulong)local_98.ptr & 0x7fffffffffffffff)) {
          iVar2 = local_88._0_4_;
          goto LAB_0012f939;
        }
        dVar12 = trunc(local_98.float64);
        (&local_68)[uVar5].float64 = dVar12;
        if (((uVar5 == 0) && (0.0 <= local_68.float64)) && (local_68.float64 < 100.0)) {
          local_68.float64 = local_68.float64 + 1900.0;
        }
        uVar5 = uVar5 + 1;
        piVar10 = piVar10 + 2;
      } while (uVar4 != uVar5);
LAB_0012f93e:
      local_88 = set_date_fields(&local_68.float64,1);
      uStack_80 = extraout_XMM0_Qb_00;
    }
    iVar2 = (int)local_78;
    val.u = local_90;
    uVar5 = local_70;
  }
  ctor.tag = uVar5;
  ctor.u.float64 = val.u.float64;
  JVar13 = js_create_from_ctor(ctx,ctor,10);
  JVar14 = JVar13;
  if ((uint)JVar13.tag != 6) {
    uVar5 = (ulong)local_88 & 0xffffffff;
    pJVar9 = (JSValue *)((ulong)local_88 & 0xffffffff00000000);
    if (local_88 == (double)(int)local_88) {
      uVar5 = (ulong)(uint)(int)local_88;
      pJVar9 = (JSValue *)0x0;
    }
    argv_00 = (JSValue *)0x7;
    if (local_88 == (double)(int)local_88) {
      argv_00 = (JSValue *)0x0;
    }
    val.u.ptr = (void *)(uVar5 | (ulong)pJVar9);
    val.tag = (int64_t)argv_00;
    JS_SetObjectData(ctx,JVar13,val);
    if (((iVar2 == 3) &&
        (JVar14 = get_date_string(ctx,JVar13,val.u.int32,argv_00,0x13),
        0xfffffff4 < (uint)JVar13.tag)) &&
       (iVar2 = *JVar13.u.ptr, *(int *)JVar13.u.ptr = iVar2 + -1, iVar2 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar13);
    }
  }
  iVar11 = JVar14.tag;
  uVar7 = (ulong)JVar14.u.ptr & 0xffffffff00000000;
  uVar5 = (ulong)JVar14.u.ptr & 0xffffffff;
LAB_0012fad3:
  JVar15.u.ptr = (void *)(uVar5 | uVar7);
  JVar15.tag = iVar11;
  return JVar15;
}

Assistant:

static JSValue js_date_constructor(JSContext *ctx, JSValueConst new_target,
                                   int argc, JSValueConst *argv)
{
    // Date(y, mon, d, h, m, s, ms)
    JSValue rv;
    int i, n;
    double a, val;

    if (JS_IsUndefined(new_target)) {
        /* invoked as function */
        argc = 0;
    }
    n = argc;
    if (n == 0) {
        val = date_now();
    } else if (n == 1) {
        JSValue v, dv;
        if (JS_VALUE_GET_TAG(argv[0]) == JS_TAG_OBJECT) {
            JSObject *p = JS_VALUE_GET_OBJ(argv[0]);
            if (p->class_id == JS_CLASS_DATE && JS_IsNumber(p->u.object_data)) {
                if (JS_ToFloat64(ctx, &val, p->u.object_data))
                    return JS_EXCEPTION;
                val = time_clip(val);
                goto has_val;
            }
        }
        v = JS_ToPrimitive(ctx, argv[0], HINT_NONE);
        if (JS_IsString(v)) {
            dv = js_Date_parse(ctx, JS_UNDEFINED, 1, (JSValueConst *)&v);
            JS_FreeValue(ctx, v);
            if (JS_IsException(dv))
                return JS_EXCEPTION;
            if (JS_ToFloat64Free(ctx, &val, dv))
                return JS_EXCEPTION;
        } else {
            if (JS_ToFloat64Free(ctx, &val, v))
                return JS_EXCEPTION;
        }
        val = time_clip(val);
    } else {
        double fields[] = { 0, 0, 1, 0, 0, 0, 0 };
        if (n > 7)
            n = 7;
        for(i = 0; i < n; i++) {
            if (JS_ToFloat64(ctx, &a, argv[i]))
                return JS_EXCEPTION;
            if (!isfinite(a))
                break;
            fields[i] = trunc(a);
            if (i == 0 && fields[0] >= 0 && fields[0] < 100)
                fields[0] += 1900;
        }
        val = (i == n) ? set_date_fields(fields, 1) : NAN;
    }
has_val:
#if 0
    JSValueConst args[3];
    args[0] = new_target;
    args[1] = ctx->class_proto[JS_CLASS_DATE];
    args[2] = JS_NewFloat64(ctx, val);
    rv = js___date_create(ctx, JS_UNDEFINED, 3, args);
#else
    rv = js_create_from_ctor(ctx, new_target, JS_CLASS_DATE);
    if (!JS_IsException(rv))
        JS_SetObjectData(ctx, rv, JS_NewFloat64(ctx, val));
#endif
    if (!JS_IsException(rv) && JS_IsUndefined(new_target)) {
        /* invoked as a function, return (new Date()).toString(); */
        JSValue s;
        s = get_date_string(ctx, rv, 0, NULL, 0x13);
        JS_FreeValue(ctx, rv);
        rv = s;
    }
    return rv;
}